

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O1

vector<float,_std::allocator<float>_> * __thiscall
mesh::createb(vector<float,_std::allocator<float>_> *__return_storage_ptr__,mesh *this,int r,int c,
             int m,vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *volt,
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *mcurrent)

{
  float fVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pfVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  allocator_type local_61 [21];
  value_type_conflict2 local_4c;
  vector<float,_std::allocator<float>_> local_48;
  
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4c = 0.0;
  std::vector<float,_std::allocator<float>_>::vector(&local_48,(long)m,&local_4c,local_61);
  std::vector<float,_std::allocator<float>_>::_M_move_assign(__return_storage_ptr__,&local_48);
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (2 < c) {
    uVar7 = 1;
    lVar9 = 4;
    do {
      if (0 < r) {
        pvVar2 = (mcurrent->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar10 = 0;
        do {
          pvVar3 = (volt->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pfVar4 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar5 = *(long *)&pvVar2[uVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data;
          uVar8 = 0;
          do {
            if (*(int *)(lVar5 + lVar9 + uVar8 * 4) == 1) {
              fVar1 = *(float *)(*(long *)&pvVar3[uVar10].
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data + uVar8 * 4);
              if ((fVar1 != 0.0) || (NAN(fVar1))) {
                iVar6 = (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff)
                             / (long)r);
                pfVar4[iVar6] = fVar1 + pfVar4[iVar6];
              }
            }
            uVar8 = uVar8 + 1;
          } while ((uint)r != uVar8);
          uVar10 = uVar10 + 1;
        } while (uVar10 != (uint)r);
      }
      uVar7 = uVar7 + (long)(r + 1);
      lVar9 = lVar9 + (long)(r + 1) * 4;
    } while ((long)uVar7 < (long)(c + -1));
  }
  return __return_storage_ptr__;
}

Assistant:

auto createb( int r, int c, int m, std::vector<std::vector<float>> &volt, std::vector<std::vector<int>> &mcurrent)
    {
        std::vector<float> b;
        int i, j, k;
      //  std::vector<float> b;
        //initialise b to 0
        b=std::vector<float> (m, 0);

        for(k = 1; k < c-1; k += r+1)
        {
            for(i = 0; i < r; i++)
            {
                for(j = 0; j < r; j++)
                {
                    if(mcurrent[i][j+k]== 1 && volt[i][j]!=0)
                    {
                        b[k/r]+= volt[i][j];
                    }
                   // std::cerr << mcurrent[i][j+k] << " and " << volt[i][j] << "\n";

//                    std::cerr << mcurrent[i][j+k] << " and " <<volt[i][j] << "\t";
//                    std::cerr << "\n";
                 //   std::cerr << b[k/r] << "\n";
                }
            }
        }
        return b;

    }